

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_well_known_types.pb.cc
# Opt level: O1

void __thiscall proto2_unittest::OneofWellKnownTypes::clear_float_field(OneofWellKnownTypes *this)

{
  long *plVar1;
  ulong uVar2;
  
  if ((this->field_0)._impl_._oneof_case_[0] == 0xb) {
    uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if ((uVar2 & 1) != 0) {
      uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
    }
    plVar1 = *(long **)&this->field_0;
    if (uVar2 == 0) {
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
      }
    }
    else if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x10))();
    }
    (this->field_0)._impl_._oneof_case_[0] = 0;
  }
  return;
}

Assistant:

void OneofWellKnownTypes::clear_float_field() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (oneof_field_case() == kFloatField) {
    if (GetArena() == nullptr) {
      delete _impl_.oneof_field_.float_field_;
    } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
      ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.oneof_field_.float_field_);
    }
    clear_has_oneof_field();
  }
}